

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O0

void __thiscall QEvdevTabletHandler::~QEvdevTabletHandler(QEvdevTabletHandler *this)

{
  void *pvVar1;
  QObject *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0011c5f8;
  if (-1 < *(int *)(in_RDI + 0x10)) {
    qt_safe_close((int)((ulong)in_RDI >> 0x20));
  }
  pvVar1 = *(void **)(in_RDI + 0x38);
  if (pvVar1 != (void *)0x0) {
    QEvdevTabletData::~QEvdevTabletData((QEvdevTabletData *)0x10f914);
    operator_delete(pvVar1,0x78);
  }
  QString::~QString((QString *)0x10f930);
  QObject::~QObject(in_RDI);
  return;
}

Assistant:

QEvdevTabletHandler::~QEvdevTabletHandler()
{
    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;
}